

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall MemoryLeakDetector::invalidateMemory(MemoryLeakDetector *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  
  pMVar1 = (this->memoryTable_).table_[(uint)((int)memory + (int)((ulong)memory / 0x49) * -0x49)].
           head_;
  while( true ) {
    if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
      return;
    }
    if (*(char **)(pMVar1 + 0x10) == memory) break;
    pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38);
  }
  (*PlatformSpecificMemset)(memory,0xcd,*(size_t *)pMVar1);
  return;
}

Assistant:

void MemoryLeakDetector::invalidateMemory(char* memory)
{
#ifndef CPPUTEST_DISABLE_HEAP_POISON
  MemoryLeakDetectorNode* node = memoryTable_.retrieveNode(memory);
  if (node)
    PlatformSpecificMemset(memory, 0xCD, node->size_);
#endif
}